

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_vector.c
# Opt level: O2

exr_result_t
exr_attr_string_vector_set_entry_with_length
          (exr_context_t ctxt,exr_attr_string_vector_t *sv,int32_t idx,char *s,int32_t len)

{
  exr_result_t eVar1;
  _internal_exr_context *pctxt;
  char *pcVar2;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if (sv != (exr_attr_string_vector_t *)0x0) {
    if (-1 < idx && idx < sv->n_strings) {
      eVar1 = exr_attr_string_set_with_length(ctxt,sv->strings + (uint)idx,s,len);
      return eVar1;
    }
    pcVar2 = "<nil>";
    if (s != (char *)0x0) {
      pcVar2 = s;
    }
    eVar1 = (**(code **)(ctxt + 0x48))
                      (ctxt,3,"Invalid index (%d of %d) assigning string vector (\'%s\', len %d)",
                       idx,sv->n_strings,pcVar2,len);
    return eVar1;
  }
  eVar1 = (**(code **)(ctxt + 0x40))
                    (ctxt,3,"Invalid reference to string vector object to assign to");
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_string_vector_set_entry_with_length (
    exr_context_t             ctxt,
    exr_attr_string_vector_t* sv,
    int32_t                   idx,
    const char*               s,
    int32_t                   len)
{
    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (!sv)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to string vector object to assign to");

    if (idx < 0 || idx >= sv->n_strings)
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid index (%d of %d) assigning string vector ('%s', len %d)",
            idx,
            sv->n_strings,
            s ? s : "<nil>",
            len);

    return exr_attr_string_set_with_length (
        ctxt, EXR_CONST_CAST (exr_attr_string_t*, sv->strings + idx), s, len);
}